

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slot.cpp
# Opt level: O0

CK_RV __thiscall Slot::getSlotInfo(Slot *this,CK_SLOT_INFO_PTR info)

{
  ostream *poVar1;
  void *__src;
  size_t sVar2;
  void *pvVar3;
  void *in_RSI;
  long in_RDI;
  char mfgID [33];
  string sDescription;
  ostringstream osDescription;
  char local_1e8 [40];
  string local_1c0 [48];
  ostringstream local_190 [376];
  void *local_18;
  CK_RV local_8;
  
  if (in_RSI == (void *)0x0) {
    local_8 = 7;
  }
  else {
    local_18 = in_RSI;
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"SoftHSM slot ID 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    std::ostream::operator<<(poVar1,*(ulong *)(in_RDI + 0x18));
    std::__cxx11::ostringstream::str();
    snprintf(local_1e8,0x21,"SoftHSM project");
    memset(local_18,0x20,0x40);
    memset((void *)((long)local_18 + 0x40),0x20,0x20);
    pvVar3 = local_18;
    __src = (void *)std::__cxx11::string::data();
    sVar2 = std::__cxx11::string::size();
    memcpy(pvVar3,__src,sVar2);
    pvVar3 = (void *)((long)local_18 + 0x40);
    sVar2 = strlen(local_1e8);
    memcpy(pvVar3,local_1e8,sVar2);
    *(undefined8 *)((long)local_18 + 0x60) = 1;
    *(undefined1 *)((long)local_18 + 0x68) = 2;
    *(undefined1 *)((long)local_18 + 0x69) = 6;
    *(undefined1 *)((long)local_18 + 0x6a) = 2;
    *(undefined1 *)((long)local_18 + 0x6b) = 6;
    local_8 = 0;
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  return local_8;
}

Assistant:

CK_RV Slot::getSlotInfo(CK_SLOT_INFO_PTR info)
{
	if (info == NULL)
	{
		return CKR_ARGUMENTS_BAD;
	}

	std::ostringstream osDescription;
	osDescription << "SoftHSM slot ID 0x" << std::hex << slotID;
	const std::string sDescription(osDescription.str());

	char mfgID[33];
	snprintf(mfgID, 33, "SoftHSM project");

	memset(info->slotDescription, ' ', 64);
	memset(info->manufacturerID, ' ', 32);
	memcpy(info->slotDescription, sDescription.data(), sDescription.size());
	memcpy(info->manufacturerID, mfgID, strlen(mfgID));

	info->flags = CKF_TOKEN_PRESENT;

	info->hardwareVersion.major = VERSION_MAJOR;
	info->hardwareVersion.minor = VERSION_MINOR;
	info->firmwareVersion.major = VERSION_MAJOR;
	info->firmwareVersion.minor = VERSION_MINOR;

	return CKR_OK;
}